

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O3

void __thiscall Assimp::ColladaExporter::WriteAnimationsLibrary(ColladaExporter *this)

{
  ostream *poVar1;
  size_t pIndex;
  string scene_name_escaped;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_58,(this->mScene->mRootNode->mName).data,&local_59);
  XMLEscape(&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (this->mScene->mNumAnimations != 0) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->field_0x38,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<library_animations>",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    std::__cxx11::string::append((char *)&this->startstr);
    if (this->mScene->mNumAnimations != 0) {
      pIndex = 0;
      do {
        WriteAnimationLibrary(this,pIndex);
        pIndex = pIndex + 1;
      } while (pIndex < this->mScene->mNumAnimations);
    }
    PopTag(this);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->field_0x38,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</library_animations>",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ColladaExporter::WriteAnimationsLibrary()
{
	const std::string scene_name_escaped = XMLEscape(mScene->mRootNode->mName.C_Str());
	
	if ( mScene->mNumAnimations > 0 ) {
		mOutput << startstr << "<library_animations>" << endstr;
		PushTag();
		
		// start recursive write at the root node
		for( size_t a = 0; a < mScene->mNumAnimations; ++a)
			WriteAnimationLibrary( a );

		PopTag();
		mOutput << startstr << "</library_animations>" << endstr;
	}
}